

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O0

bool __thiscall MeCab::Writer::writeEM(Writer *this,Lattice *lattice,StringBuffer *os)

{
  StringBuffer *this_00;
  size_t in_RCX;
  StringBuffer *in_RDX;
  long *in_RSI;
  Path *path;
  Node *node;
  double in_stack_00000028;
  StringBuffer *in_stack_00000030;
  char *in_stack_ffffffffffffffd8;
  char n_00;
  _func_int **n;
  
  for (this_00 = (StringBuffer *)(**(code **)(*in_RSI + 0x10))(); this_00 != (StringBuffer *)0x0;
      this_00 = (StringBuffer *)this_00->size_) {
    if (0.0001 <= *(float *)((long)&this_00[2].size_ + 4)) {
      StringBuffer::operator<<(this_00,in_stack_ffffffffffffffd8);
      if (this_00[1].field_0x27 == '\x02') {
        StringBuffer::operator<<(this_00,in_stack_ffffffffffffffd8);
      }
      else if (this_00[1].field_0x27 == '\x03') {
        StringBuffer::operator<<(this_00,in_stack_ffffffffffffffd8);
      }
      else {
        StringBuffer::write(in_RDX,(int)this_00[1].size_,
                            (void *)(ulong)*(ushort *)((long)&this_00[1].ptr_ + 4),in_RCX);
      }
      StringBuffer::operator<<(this_00,(char)((ulong)in_stack_ffffffffffffffd8 >> 0x38));
      StringBuffer::operator<<(this_00,in_stack_ffffffffffffffd8);
      n_00 = (char)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
      StringBuffer::operator<<(this_00,n_00);
      StringBuffer::operator<<(in_stack_00000030,in_stack_00000028);
      StringBuffer::operator<<(this_00,n_00);
    }
    for (n = this_00[1]._vptr_StringBuffer; n != (_func_int **)0x0; n = (_func_int **)n[3]) {
      if (0.0001 <= *(float *)((long)n + 0x24)) {
        StringBuffer::operator<<(this_00,(char *)n);
        StringBuffer::operator<<(this_00,(char *)n);
        StringBuffer::operator<<(this_00,(char)((ulong)n >> 0x38));
        StringBuffer::operator<<(this_00,(char *)n);
        StringBuffer::operator<<(this_00,(char)((ulong)n >> 0x38));
        StringBuffer::operator<<(in_stack_00000030,in_stack_00000028);
        StringBuffer::operator<<(this_00,(char)((ulong)n >> 0x38));
      }
    }
    in_stack_ffffffffffffffd8 = (char *)0x0;
  }
  StringBuffer::operator<<((StringBuffer *)0x0,in_stack_ffffffffffffffd8);
  return true;
}

Assistant:

bool Writer::writeEM(Lattice *lattice, StringBuffer *os) const {
  static const float min_prob = 0.0001;
  for (const Node *node = lattice->bos_node(); node; node = node->next) {
    if (node->prob >= min_prob) {
      *os << "U\t";
      if (node->stat == MECAB_BOS_NODE) {
        *os << "BOS";
      } else if (node->stat == MECAB_EOS_NODE) {
        *os << "EOS";
      }  else {
        os->write(node->surface, node->length);
      }
      *os << '\t' << node->feature << '\t' << node->prob << '\n';
    }
    for (const Path *path = node->lpath; path; path = path->lnext) {
      if (path->prob >= min_prob) {
        *os << "B\t" << path->lnode->feature << '\t'
            << node->feature << '\t' << path->prob << '\n';
      }
    }
  }
  *os << "EOS\n";
  return true;
}